

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool __thiscall ClipperLib::Clipper::IsContributing(Clipper *this,TEdge *edge)

{
  PolyFillType PVar1;
  PolyFillType PVar2;
  
  PVar1 = this->m_ClipFillType;
  PVar2 = this->m_SubjFillType;
  if (edge->PolyTyp == ptSubject) {
    PVar1 = this->m_SubjFillType;
    PVar2 = this->m_ClipFillType;
  }
  if (PVar1 == pftPositive) {
LAB_001112c5:
    if (edge->WindCnt != 1) {
      return false;
    }
  }
  else if (PVar1 == pftNonZero) {
    if ((edge->WindCnt + 1U & 0xfffffffd) != 0) {
      return false;
    }
  }
  else if (PVar1 == pftEvenOdd) {
    if (edge->WindDelta == 0) goto LAB_001112c5;
  }
  else if (edge->WindCnt != -1) {
    return false;
  }
  switch(this->m_ClipType) {
  case ctDifference:
    if (edge->PolyTyp == ptSubject) goto switchD_001112f3_caseD_1;
  case ctIntersection:
    if (PVar2 < pftPositive) {
      return edge->WindCnt2 != 0;
    }
    if (PVar2 == pftPositive) {
      return 0 < edge->WindCnt2;
    }
    return SUB41((uint)edge->WindCnt2 >> 0x1f,0);
  case ctXor:
    if (edge->WindDelta != 0) {
      return true;
    }
  case ctUnion:
switchD_001112f3_caseD_1:
    if (PVar2 < pftPositive) {
      return edge->WindCnt2 == 0;
    }
    if (PVar2 == pftPositive) {
      return edge->WindCnt2 < 1;
    }
    return -1 < edge->WindCnt2;
  default:
    return true;
  }
}

Assistant:

bool Clipper::IsContributing(const TEdge& edge) const
{
  PolyFillType pft, pft2;
  if (edge.PolyTyp == ptSubject)
  {
    pft = m_SubjFillType;
    pft2 = m_ClipFillType;
  } else
  {
    pft = m_ClipFillType;
    pft2 = m_SubjFillType;
  }

  switch(pft)
  {
    case pftEvenOdd: 
      //return false if a subj line has been flagged as inside a subj polygon
      if (edge.WindDelta == 0 && edge.WindCnt != 1) return false;
      break;
    case pftNonZero:
      if (Abs(edge.WindCnt) != 1) return false;
      break;
    case pftPositive: 
      if (edge.WindCnt != 1) return false;
      break;
    default: //pftNegative
      if (edge.WindCnt != -1) return false;
  }

  switch(m_ClipType)
  {
    case ctIntersection:
      switch(pft2)
      {
        case pftEvenOdd: 
        case pftNonZero: 
          return (edge.WindCnt2 != 0);
        case pftPositive: 
          return (edge.WindCnt2 > 0);
        default: 
          return (edge.WindCnt2 < 0);
      }
      break;
    case ctUnion:
      switch(pft2)
      {
        case pftEvenOdd: 
        case pftNonZero: 
          return (edge.WindCnt2 == 0);
        case pftPositive: 
          return (edge.WindCnt2 <= 0);
        default: 
          return (edge.WindCnt2 >= 0);
      }
      break;
    case ctDifference:
      if (edge.PolyTyp == ptSubject)
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.WindCnt2 == 0);
          case pftPositive: 
            return (edge.WindCnt2 <= 0);
          default: 
            return (edge.WindCnt2 >= 0);
        }
      else
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.WindCnt2 != 0);
          case pftPositive: 
            return (edge.WindCnt2 > 0);
          default: 
            return (edge.WindCnt2 < 0);
        }
      break;
    case ctXor:
      if (edge.WindDelta == 0) //XOr always contributing unless open
        switch(pft2)
        {
          case pftEvenOdd: 
          case pftNonZero: 
            return (edge.WindCnt2 == 0);
          case pftPositive: 
            return (edge.WindCnt2 <= 0);
          default: 
            return (edge.WindCnt2 >= 0);
        }
      else 
        return true;
      break;
    default:
      return true;
  }
}